

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.h
# Opt level: O1

void __thiscall
slang::analysis::DataFlowAnalysis::handleTiming(DataFlowAnalysis *this,TimingControl *timing)

{
  NonProceduralExprVisitor visitor;
  AnalysisContext *local_10;
  Symbol *local_8;
  
  if (timing->kind != Invalid) {
    local_10 = this->context;
    local_8 = (this->
              super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
              ).super_FlowAnalysisBase.rootSymbol;
    ast::TimingControl::visit<slang::analysis::NonProceduralExprVisitor>
              (timing,(Result *)&stack0xfffffffffffffff0);
    return;
  }
  (this->
  super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>).
  super_FlowAnalysisBase.bad = true;
  return;
}

Assistant:

bool bad() const { return kind == TimingControlKind::Invalid; }